

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O1

void __thiscall
cimod::BinaryPolynomialModel<unsigned_int,_double>::UpdateVariablesToIntegers
          (BinaryPolynomialModel<unsigned_int,_double> *this)

{
  ulong *puVar1;
  pointer puVar2;
  ulong uVar3;
  long lVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  GenerateSortedVariables(&local_38,this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->sorted_variables_,&local_38);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->variables_to_integers_)._M_h);
  puVar2 = (this->sorted_variables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->sorted_variables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      puVar1 = (ulong *)std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&this->variables_to_integers_,
                                     (key_type *)((long)puVar2 + lVar4));
      *puVar1 = uVar3;
      uVar3 = uVar3 + 1;
      puVar2 = (this->sorted_variables_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 4;
    } while (uVar3 < (ulong)((long)(this->sorted_variables_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2));
  }
  this->relabel_flag_for_variables_to_integers_ = false;
  return;
}

Assistant:

void UpdateVariablesToIntegers() {
      sorted_variables_ = GenerateSortedVariables();
      variables_to_integers_.clear();
      for ( std::size_t i = 0; i < sorted_variables_.size(); ++i ) {
        variables_to_integers_[ sorted_variables_[ i ] ] = i;
      }
      relabel_flag_for_variables_to_integers_ = false;
    }